

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

bool __thiscall QAccessibleTable::unselectRow(QAccessibleTable *this,int row)

{
  QAccessibleObject *pQVar1;
  char cVar2;
  SelectionMode SVar3;
  int iVar4;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar5;
  QItemSelectionModel *pQVar6;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar7;
  bool bVar8;
  long in_FS_OFFSET;
  QModelIndex local_f0;
  QArrayDataPointer<QItemSelectionRange> local_d8;
  QArrayDataPointer<QItemSelectionRange> local_b8;
  QModelIndex local_98;
  QModelIndex local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar5 = QAbstractItemView::model(this_00);
  pQVar6 = QAbstractItemView::selectionModel(this_00);
  if (pQVar6 == (QItemSelectionModel *)0x0 || pQVar5 == (QAbstractItemModel *)0x0) {
    bVar8 = false;
    goto LAB_00527f41;
  }
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex(&local_78,this_00);
  local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.r = -0x55555556;
  local_98.c = -0x55555556;
  local_98.i._0_4_ = 0xaaaaaaaa;
  local_98.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
  this_01 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar7 = QAbstractItemView::model(this_01);
  (**(code **)(*(long *)pQVar7 + 0x60))(&local_98,pQVar7,row,0,&local_78);
  bVar8 = false;
  if (((local_98.r < 0) || (bVar8 = false, local_98.c < 0)) ||
     (local_98.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_00527f41;
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)&local_b8,&local_98,&local_98);
  SVar3 = QAbstractItemView::selectionMode(this_00);
  if (SVar3 == ContiguousSelection) {
    iVar4 = (**(code **)(*(long *)this + 0x50))(this);
    if (iVar4 == 1) goto LAB_00527e51;
    if (((row == 0) ||
        (cVar2 = QItemSelectionModel::isRowSelected((int)pQVar6,(QModelIndex *)(ulong)(row - 1)),
        cVar2 != '\0')) &&
       (cVar2 = QItemSelectionModel::isRowSelected((int)pQVar6,(QModelIndex *)(ulong)(row + 1)),
       cVar2 != '\0')) {
      iVar4 = (**(code **)(*(long *)this + 0x60))(this);
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_f0,pQVar5,iVar4 + -1,0,&local_78);
      QItemSelection::QItemSelection((QItemSelection *)&local_d8,&local_98,&local_f0);
      local_58.size = local_b8.size;
      local_58.ptr = local_b8.ptr;
      local_58.d = local_b8.d;
      local_b8.size = local_d8.size;
      local_b8.ptr = local_d8.ptr;
      local_b8.d = local_d8.d;
      local_d8.size = 0;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (QItemSelectionRange *)0x0;
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_d8);
    }
LAB_00527f20:
    (**(code **)(*(long *)pQVar6 + 0x70))(pQVar6,&local_b8,0x24);
    bVar8 = true;
  }
  else {
    if ((SVar3 != SingleSelection) || (iVar4 = (**(code **)(*(long *)this + 0x50))(), iVar4 != 1))
    goto LAB_00527f20;
LAB_00527e51:
    bVar8 = false;
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b8);
LAB_00527f41:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QAccessibleTable::unselectRow(int row)
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = view()->model()->index(row, 0, rootIndex);
    if (!index.isValid())
        return false;

    QItemSelection selection(index, index);

    switch (theView->selectionMode()) {
    case QAbstractItemView::SingleSelection:
        //In SingleSelection and ContiguousSelection once an item
        //is selected, there's no way for the user to unselect all items
        if (selectedRowCount() == 1)
            return false;
        break;
    case QAbstractItemView::ContiguousSelection:
        if (selectedRowCount() == 1)
            return false;

        if ((!row || selectionModel->isRowSelected(row - 1, rootIndex))
            && selectionModel->isRowSelected(row + 1, rootIndex)) {
            //If there are rows selected both up the current row and down the current rown,
            //the ones which are down the current row will be deselected
            selection = QItemSelection(index, theModel->index(rowCount() - 1, 0, rootIndex));
        }
        break;
    default:
        break;
    }

    selectionModel->select(selection, QItemSelectionModel::Deselect | QItemSelectionModel::Rows);
    return true;
}